

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_arg_test.cc
# Opt level: O0

void re2::REArgTestInt16Test(void)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  LogMessage local_340;
  LogMessage local_1b0;
  byte local_2a;
  undefined1 local_29;
  bool success;
  char *pcStack_28;
  bool retval;
  char *p;
  Arg arg;
  int i;
  int16 r;
  
  for (arg.parser_._0_4_ = 0; (int)arg.parser_ < 0x19; arg.parser_._0_4_ = (int)arg.parser_ + 1) {
    RE2::Arg::Arg((Arg *)&p,(short *)((long)&arg.parser_ + 6));
    __s = *(char **)(kSuccessTable + (long)(int)arg.parser_ * 0x18);
    pcStack_28 = __s;
    sVar1 = strlen(__s);
    local_29 = RE2::Arg::Parse((Arg *)&p,__s,(int)sVar1);
    local_2a = kSuccessTable[(long)(int)arg.parser_ * 0x18 + 0x10] & 1;
    if (local_29 != local_2a) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_1b0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_arg_test.cc"
                 ,0x6e);
      poVar2 = LogMessage::stream(&local_1b0);
      poVar2 = std::operator<<(poVar2,"Check failed: (retval) == (success)");
      poVar2 = std::operator<<(poVar2,"Parsing \'");
      poVar2 = std::operator<<(poVar2,pcStack_28);
      poVar2 = std::operator<<(poVar2,"\' for type int16 should return ");
      std::ostream::operator<<(poVar2,(bool)(local_2a & 1));
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b0);
    }
    if (((local_2a & 1) != 0) &&
       (arg.parser_._6_2_ !=
        (short)*(undefined8 *)(kSuccessTable + (long)(int)arg.parser_ * 0x18 + 8))) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_340,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_arg_test.cc"
                 ,0x6e);
      poVar2 = LogMessage::stream(&local_340);
      std::operator<<(poVar2,"Check failed: (r) == ((int16)kSuccessTable[i].value)");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_340);
    }
  }
  return;
}

Assistant:

TEST(REArgTest, Int16Test) {
  PARSE_FOR_TYPE(int16, 0);
}